

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::Close(RWSocket *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_20 [8];
  shared_ptr<cppnet::Dispatcher> dispatcher;
  RWSocket *this_local;
  
  dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  (*(this->super_Socket)._vptr_Socket[10])();
  if (this->_timer_id != 0) {
    Socket::GetDispatcher((Socket *)local_20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
      Dispatcher::StopTimer(this_00,this->_timer_id);
    }
    this->_timer_id = 0;
    std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)local_20);
  }
  return;
}

Assistant:

void RWSocket::Close() {
    Disconnect();
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}